

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SrcListAssignCursors(Parse *pParse,SrcList *pList)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  
  if ((pList != (SrcList *)0x0) && (0 < pList->nSrc)) {
    pbVar3 = &pList->a[0].fg.field_0x1;
    iVar2 = 0;
    do {
      if (*(int *)(pbVar3 + 3) < 0) {
        iVar1 = pParse->nTab;
        pParse->nTab = iVar1 + 1;
        *(int *)(pbVar3 + 3) = iVar1;
        if ((*pbVar3 & 4) != 0) {
          sqlite3SrcListAssignCursors(pParse,*(SrcList **)(**(long **)(pbVar3 + 0x27) + 0x28));
        }
      }
      iVar2 = iVar2 + 1;
      pbVar3 = pbVar3 + 0x48;
    } while (iVar2 < pList->nSrc);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListAssignCursors(Parse *pParse, SrcList *pList){
  int i;
  SrcItem *pItem;
  assert( pList || pParse->db->mallocFailed );
  if( ALWAYS(pList) ){
    for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
      if( pItem->iCursor>=0 ) continue;
      pItem->iCursor = pParse->nTab++;
      if( pItem->fg.isSubquery ){
        assert( pItem->u4.pSubq!=0 );
        assert( pItem->u4.pSubq->pSelect!=0 );
        assert( pItem->u4.pSubq->pSelect->pSrc!=0 );
        sqlite3SrcListAssignCursors(pParse, pItem->u4.pSubq->pSelect->pSrc);
      }
    }
  }
}